

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O2

void __thiscall libcellml::XmlDoc::~XmlDoc(XmlDoc *this)

{
  XmlDocImpl *pXVar1;
  
  pXVar1 = this->mPimpl;
  if (pXVar1->mXmlDocPtr != (xmlDocPtr)0x0) {
    xmlFreeDoc();
    pXVar1 = this->mPimpl;
    if (pXVar1 == (XmlDocImpl *)0x0) {
      pXVar1 = (XmlDocImpl *)0x0;
      goto LAB_0022f06a;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&pXVar1->mXmlErrors);
LAB_0022f06a:
  operator_delete(pXVar1,0x28);
  return;
}

Assistant:

XmlDoc::~XmlDoc()
{
    if (mPimpl->mXmlDocPtr != nullptr) {
        xmlFreeDoc(mPimpl->mXmlDocPtr);
    }
    delete mPimpl;
}